

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O2

Iterator __thiscall
axl::sl::
ListBase<axl::sl::BoxListEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>_>,_axl::sl::ConstBoxIterator<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>_>_>
::insertTail(ListBase<axl::sl::BoxListEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>_>,_axl::sl::ImplicitPtrCast<axl::sl::BoxListEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>_>,_axl::sl::ListLink>,_axl::sl::BoxIterator<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>_>,_axl::sl::ConstBoxIterator<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>_>_>
             *this,BoxListEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>_> *p)

{
  size_t *psVar1;
  BoxListEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>_> *pBVar2;
  ListLink *link;
  
  pBVar2 = (this->
           super_ListData<axl::sl::BoxListEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>_>_>
           ).m_tail;
  (p->super_ListLink).m_next = (ListLink *)0x0;
  (p->super_ListLink).m_prev = &pBVar2->super_ListLink;
  if (pBVar2 == (BoxListEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>_> *)0x0)
  {
    pBVar2 = (BoxListEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>_> *)this;
  }
  (pBVar2->super_ListLink).m_next = &p->super_ListLink;
  (this->
  super_ListData<axl::sl::BoxListEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>_>_>
  ).m_tail = p;
  psVar1 = &(this->
            super_ListData<axl::sl::BoxListEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>_>_>
            ).m_count;
  *psVar1 = *psVar1 + 1;
  return (BoxIteratorImpl<axl::sl::BoxIterator<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>_>,_axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::BoxListEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>_>,_axl::sl::ListLink>
          )(BoxIteratorImpl<axl::sl::BoxIterator<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>_>,_axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_axl::sl::BoxListEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>_>,_axl::sl::ListLink>
            )p;
}

Assistant:

Iterator
	insertTail(T* p) {
		ListLink* link = GetLink()(p);
		ListLink* tailLink = Iterator::getLinkFromEntry(this->m_tail);

		link->m_next = NULL;
		link->m_prev = tailLink;

		if (tailLink)
			tailLink->m_next = link;
		else
			this->m_head = p;

		this->m_tail = p;
		this->m_count++;

		return p;
	}